

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_istype(lua_State *L,BCReg ra,BCReg tp)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  lua_State *unaff_retaddr;
  char *in_stack_00000030;
  int in_stack_0000003c;
  lua_State *in_stack_00000040;
  int in_stack_ffffffffffffffec;
  
  *(long *)(in_RDI + 0x18) =
       *(long *)(in_RDI + 0x10) +
       (long)(int)(uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) +
                                                  0x10) - 0x39) * 8;
  if (in_EDX == 0xf) {
    lj_lib_checknum((lua_State *)CONCAT44(in_ESI + 1,0xe),in_stack_ffffffffffffffec);
  }
  else {
    if (in_EDX != 5) {
      lj_err_argtype(in_stack_00000040,in_stack_0000003c,in_stack_00000030);
    }
    lj_lib_checkstr(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void lj_meta_istype(lua_State *L, BCReg ra, BCReg tp)
{
  L->top = curr_topL(L);
  ra++; tp--;
  lj_assertL(LJ_DUALNUM || tp != ~LJ_TNUMX, "bad type for ISTYPE");
  if (LJ_DUALNUM && tp == ~LJ_TNUMX) lj_lib_checkint(L, ra);
  else if (tp == ~LJ_TNUMX+1) lj_lib_checknum(L, ra);
  else if (tp == ~LJ_TSTR) lj_lib_checkstr(L, ra);
  else lj_err_argtype(L, ra, lj_obj_itypename[tp]);
}